

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 88_mergeSortedArray.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  pointer piVar2;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  allocator_type local_61;
  undefined8 local_60;
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v1;
  
  v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x400000001;
  v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x6;
  v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
  ._0_4_ = 0;
  __l._M_len = 5;
  __l._M_array = (iterator)&v2;
  std::vector<int,_std::allocator<int>_>::vector(&v1,__l,(allocator_type *)&local_60);
  local_60 = 0x500000003;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_60;
  std::vector<int,_std::allocator<int>_>::vector(&v2,__l_00,&local_61);
  mergeElegantSolution(&v1,3,&v2,2);
  for (piVar2 = v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar2 != v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish; piVar2 = piVar2 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar2);
    std::operator<<(poVar1," ");
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v2.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v1.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main()
{
	vector<int> v1 = {1,4,6,0,0}, v2 = {3,5};
	mergeElegantSolution(v1,3,v2,2);
	for (int n : v1)
		cout<<n<<" ";

}